

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::moveAppend
          (QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *this,
          X509CertificateExtension *b,X509CertificateExtension *e)

{
  qsizetype *pqVar1;
  X509CertificateExtension *pXVar2;
  
  if (b != e) {
    pXVar2 = (this->
             super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
             ptr;
    for (; b < e; b = b + 1) {
      QTlsPrivate::X509CertificateBase::X509CertificateExtension::X509CertificateExtension
                (pXVar2 + (this->
                          super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
                          ).size,b);
      pqVar1 = &(this->
                super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>)
                .size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }